

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompactCounters.h
# Opt level: O0

uint32 __thiscall
Js::CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields>::Increase
          (CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields> *this,
          CounterFields typeEnum,FunctionBody *host)

{
  Fields FVar1;
  ushort uVar2;
  code *pcVar3;
  bool bVar4;
  Fields *pFVar5;
  undefined4 *puVar6;
  uint8 type;
  FunctionBody *host_local;
  CounterFields typeEnum_local;
  CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields> *this_local;
  
  if (this->fieldSize == '\x01') {
    pFVar5 = Memory::
             WriteBarrierPtr<Js::CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields>::Fields>
             ::operator->(&this->fields);
    if ((byte)pFVar5[typeEnum] < 0xff) {
      pFVar5 = Memory::
               WriteBarrierPtr<Js::CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields>::Fields>
               ::operator->(&this->fields);
      FVar1 = pFVar5[typeEnum];
      pFVar5[typeEnum] = (Fields)((char)FVar1 + 1);
      this_local._4_4_ = (uint)(byte)FVar1;
    }
    else {
      AllocCounters<unsigned_short>(this,host);
      this_local._4_4_ = Increase(&host->counters,typeEnum,host);
    }
  }
  else if (this->fieldSize == '\x02') {
    pFVar5 = Memory::
             WriteBarrierPtr<Js::CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields>::Fields>
             ::operator->(&this->fields);
    if (*(ushort *)(pFVar5 + (ulong)typeEnum * 2) < 0xffff) {
      pFVar5 = Memory::
               WriteBarrierPtr<Js::CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields>::Fields>
               ::operator->(&this->fields);
      uVar2 = *(ushort *)(pFVar5 + (ulong)typeEnum * 2);
      *(ushort *)(pFVar5 + (ulong)typeEnum * 2) = uVar2 + 1;
      this_local._4_4_ = (uint)uVar2;
    }
    else {
      AllocCounters<unsigned_int>(this,host);
      this_local._4_4_ = Increase(&host->counters,typeEnum,host);
    }
  }
  else {
    if (this->fieldSize != '\x04') {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/CompactCounters.h"
                                  ,0x8f,"(fieldSize == 4)","fieldSize == 4");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pFVar5 = Memory::
             WriteBarrierPtr<Js::CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields>::Fields>
             ::operator->(&this->fields);
    this_local._4_4_ = *(uint *)(pFVar5 + (ulong)typeEnum * 4);
    *(uint *)(pFVar5 + (ulong)typeEnum * 4) = this_local._4_4_ + 1;
  }
  return this_local._4_4_;
}

Assistant:

uint32 Increase(CountT typeEnum, T* host)
        {
            uint8 type = static_cast<uint8>(typeEnum);
            if (fieldSize == 1)
            {
                if (this->fields->u8Fields[type] < UINT8_MAX)
                {
                    return this->fields->u8Fields[type]++;
                }
                else
                {
                    AllocCounters<uint16>(host);
                    return host->counters.Increase(typeEnum, host);
                }
            }

            if (fieldSize == 2)
            {
                if (this->fields->u16Fields[type] < UINT16_MAX)
                {
                    return this->fields->u16Fields[type]++;
                }
                else
                {
                    AllocCounters<uint32>(host);
                    return host->counters.Increase(typeEnum, host);
                }
            }

            Assert(fieldSize == 4);
            return this->fields->u32Fields[type]++;
        }